

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

BYTE __thiscall Spi::recv_byte(Spi *this)

{
  int iVar1;
  ostream *poVar2;
  BYTE byInputBuffer [1];
  DWORD dwNumBytesRead;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  
  dwNumBytesRead = 0;
  while( true ) {
    iVar1 = FT_Read(this->ftHandle,byInputBuffer,1,&dwNumBytesRead);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Read error.");
      std::endl<char,std::char_traits<char>>(poVar2);
      error(this,2);
    }
    if (dwNumBytesRead == 1) break;
    local_30.__r = 100;
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_30);
  }
  return byInputBuffer[0];
}

Assistant:

BYTE Spi::recv_byte() {
	FT_STATUS ftStatus;
	BYTE byInputBuffer[1];
	DWORD dwNumBytesRead = 0;
	while (1) {
		ftStatus = FT_Read(ftHandle, &byInputBuffer, 1, &dwNumBytesRead);
		if (ftStatus != FT_OK) {
			cerr << "Read error." << endl;
			error(2);
		}
		if (dwNumBytesRead == 1)
			break;
		std::this_thread::sleep_for(std::chrono::microseconds(100));
	}
	return byInputBuffer[0];
}